

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O3

void __thiscall NaConfigFile::~NaConfigFile(NaConfigFile *this)

{
  char *pcVar1;
  
  (this->super_NaDataStream)._vptr_NaDataStream = (_func_int **)&PTR__NaConfigFile_00173e88;
  if (this->szMagicString != (char *)0x0) {
    operator_delete__(this->szMagicString);
  }
  if (this->szFileExtString != (char *)0x0) {
    operator_delete__(this->szFileExtString);
  }
  if (this->szMarksBuf != (char *)0x0) {
    operator_delete__(this->szMarksBuf);
  }
  (this->arReg)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00173ef0;
  NaDynAr<NaCPRegItem>::clean(&this->arReg);
  (this->super_NaDataStream)._vptr_NaDataStream = (_func_int **)&PTR__NaDataStream_00173e28;
  pcVar1 = (this->super_NaDataStream).szFormatBuf;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

NaConfigFile::~NaConfigFile ()
{
    delete[] szMagicString;
    delete[] szFileExtString;
    delete[] szMarksBuf;
}